

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O1

bool __thiscall
duckdb::BinaryDeserializer::OnOptionalPropertyBegin
          (BinaryDeserializer *this,field_id_t field_id,char *s)

{
  field_id_t fVar1;
  undefined8 in_RAX;
  unsigned_short value;
  unsigned_short value_1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (this->has_buffered_field == false) {
    (**this->stream->_vptr_ReadStream)(this->stream,(long)&uStack_28 + 4,2);
    this->buffered_field = uStack_28._4_2_;
    this->has_buffered_field = true;
  }
  fVar1 = this->buffered_field;
  if (fVar1 == field_id) {
    if (this->has_buffered_field == false) {
      (**this->stream->_vptr_ReadStream)(this->stream,(long)&uStack_28 + 6,2);
      this->buffered_field = uStack_28._6_2_;
    }
    else {
      this->has_buffered_field = false;
    }
  }
  return fVar1 == field_id;
}

Assistant:

bool BinaryDeserializer::OnOptionalPropertyBegin(const field_id_t field_id, const char *s) {
	auto next_field = PeekField();
	auto present = next_field == field_id;
	if (present) {
		ConsumeField();
	}
	return present;
}